

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::DenselySampledSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DenselySampledSpectrum *this)

{
  long lVar1;
  ulong uVar2;
  string ret;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<int_const&,int_const&>
            (__return_storage_ptr__,
             "[ DenselySampledSpectrum lambda_min: %d lambda_max: %d values: [ ",&this->lambda_min,
             &this->lambda_max);
  if ((this->values).nStored != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<float_const&>
                (&local_50,"%f ",(float *)((long)(this->values).ptr + lVar1));
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 4;
    } while (uVar2 < (this->values).nStored);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string DenselySampledSpectrum::ToString() const {
    std::string s = StringPrintf("[ DenselySampledSpectrum lambda_min: %d lambda_max: %d "
                                 "values: [ ",
                                 lambda_min, lambda_max);
    for (int i = 0; i < values.size(); ++i)
        s += StringPrintf("%f ", values[i]);
    s += "] ]";
    return s;
}